

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-all.cc
# Opt level: O0

bool testing::Test::HasNonfatalFailure(void)

{
  bool bVar1;
  UnitTestImpl *this;
  TestResult *this_00;
  
  this = internal::GetUnitTestImpl();
  this_00 = internal::UnitTestImpl::current_test_result(this);
  bVar1 = TestResult::HasNonfatalFailure(this_00);
  return bVar1;
}

Assistant:

bool Test::HasNonfatalFailure() {
  return internal::GetUnitTestImpl()->current_test_result()->
      HasNonfatalFailure();
}